

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O3

void ipred_bi_uv(pel *src,pel *dst,int i_dst,int w,int h,int bit_depth)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  byte bVar10;
  pel pVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  pel *ppVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  undefined1 uVar33;
  int ref_up [128];
  int wy [128];
  int le [128];
  int up [128];
  ulong local_a88;
  undefined8 uStack_a38;
  uint auStack_838 [128];
  int aiStack_638 [128];
  int aiStack_438 [128];
  int aiStack_238 [130];
  
  bVar1 = g_tbl_log2[w];
  bVar2 = g_tbl_log2[h];
  iVar13 = (int)(char)bVar1 - (int)(char)bVar2;
  bVar10 = bVar2;
  if ((int)(char)bVar1 < (int)(char)bVar2) {
    bVar10 = bVar1;
  }
  iVar25 = 1 << (bVar2 + bVar1 & 0x1f);
  uVar7 = w * 2;
  uVar19 = h * 2;
  iVar20 = -iVar13;
  if ((char)bVar2 < (char)bVar1) {
    iVar20 = iVar13;
  }
  if (0 < (int)uVar7) {
    uVar16 = 0;
    do {
      auStack_838[uVar16] = (uint)src[uVar16 + 2];
      uVar16 = uVar16 + 1;
    } while (uVar7 != uVar16);
  }
  if (0 < (int)uVar19) {
    ppVar17 = src + -2;
    uVar16 = 0;
    do {
      uVar33 = (undefined1)((ushort)*(undefined2 *)ppVar17 >> 8);
      *(ulong *)((long)&uStack_a38 + uVar16 * 4) =
           (ulong)(CONCAT14(uVar33,(uint)CONCAT12(uVar33,*(undefined2 *)ppVar17)) & 0xffffff00ff) &
           0xffffffff0000ffff;
      uVar16 = uVar16 + 2;
      ppVar17 = ppVar17 + -2;
    } while (uVar16 < uVar19);
  }
  lVar24 = (long)(int)uVar7;
  bVar3 = src[lVar24];
  uVar15 = (uint)bVar3;
  bVar4 = src[-(long)(int)uVar19];
  uVar26 = (uint)bVar4;
  if (w == h) {
    iVar13 = (uint)bVar4 + (uint)bVar3;
    uVar22 = (uint)bVar4 + (uint)bVar3 + 1 >> 1 & 0xff;
  }
  else {
    uVar22 = (int)((1 << (bVar10 + 5 & 0x1f)) +
                  ((uVar26 << (bVar2 & 0x1f)) + (uVar15 << (bVar1 & 0x1f))) *
                  *(int *)(&DAT_00183bb0 + (long)iVar20 * 4)) >> (bVar10 + 6 & 0x1f);
    iVar13 = uVar26 + uVar15;
  }
  bVar3 = src[lVar24 + 1];
  uVar14 = (uint)bVar3;
  bVar4 = src[h * -2 + 1];
  uVar8 = (uint)bVar4;
  if (w == h) {
    iVar20 = (uint)bVar4 + (uint)bVar3;
    uVar29 = (uint)bVar4 + (uint)bVar3 + 1 >> 1 & 0xff;
  }
  else {
    uVar29 = (int)((1 << (bVar10 + 5 & 0x1f)) +
                  ((uVar8 << (bVar2 & 0x1f)) + (uVar14 << (bVar1 & 0x1f))) *
                  *(int *)(&DAT_00183bb0 + (long)iVar20 * 4)) >> (bVar10 + 6 & 0x1f);
    iVar20 = uVar8 + uVar14;
  }
  if (0 < (int)uVar7) {
    lVar30 = 0;
    do {
      uVar5 = auStack_838[lVar30];
      uVar6 = auStack_838[lVar30 + 1];
      aiStack_238[lVar30] = uVar26 - uVar5;
      aiStack_238[lVar30 + 1] = uVar8 - uVar6;
      auStack_838[lVar30] = uVar5 << (bVar2 & 0x1f);
      auStack_838[lVar30 + 1] = uVar6 << (bVar2 & 0x1f);
      lVar30 = lVar30 + 2;
    } while (lVar30 < lVar24);
  }
  if (0 < (int)uVar19) {
    iVar9 = 0;
    iVar21 = 0;
    uVar16 = 0;
    do {
      iVar27 = *(int *)((long)&uStack_a38 + uVar16 * 4);
      iVar23 = *(int *)((long)&uStack_a38 + uVar16 * 4 + 4);
      aiStack_438[uVar16] = uVar15 - iVar27;
      aiStack_438[uVar16 + 1] = uVar14 - iVar23;
      *(int *)((long)&uStack_a38 + uVar16 * 4) = iVar27 << (bVar1 & 0x1f);
      *(int *)((long)&uStack_a38 + uVar16 * 4 + 4) = iVar23 << (bVar1 & 0x1f);
      aiStack_638[uVar16] = iVar21;
      aiStack_638[uVar16 + 1] = iVar9;
      uVar16 = uVar16 + 2;
      iVar21 = iVar21 + (uVar22 * 2 - iVar13);
      iVar9 = iVar9 + (uVar29 * 2 - iVar20);
    } while (uVar16 < uVar19);
  }
  if (0 < h) {
    bVar10 = bVar2 + bVar1 + 1;
    uVar19 = ~(-1 << ((byte)bit_depth & 0x1f));
    local_a88 = 0;
    do {
      if (0 < (int)uVar7) {
        lVar30 = (long)(local_a88 << 0x21) >> 0x1e;
        lVar12 = (long)((int)local_a88 * 2);
        iVar13 = aiStack_438[lVar12];
        iVar20 = *(int *)((long)aiStack_438 + lVar30 + 4);
        iVar9 = aiStack_638[lVar12];
        iVar21 = *(int *)((long)aiStack_638 + lVar30 + 4);
        iVar27 = *(int *)((long)&uStack_a38 + lVar30 + 4);
        iVar23 = *(int *)((long)&uStack_a38 + lVar12 * 4);
        lVar30 = 0;
        iVar18 = iVar25;
        iVar28 = iVar25;
        do {
          iVar23 = iVar23 + iVar13;
          iVar27 = iVar27 + iVar20;
          iVar31 = (int)*(undefined8 *)(auStack_838 + lVar30) +
                   (int)*(undefined8 *)(aiStack_238 + lVar30);
          iVar32 = (int)((ulong)*(undefined8 *)(auStack_838 + lVar30) >> 0x20) +
                   (int)((ulong)*(undefined8 *)(aiStack_238 + lVar30) >> 0x20);
          uVar22 = (iVar23 << (bVar2 & 0x1f)) + iVar28 + (iVar31 << (bVar1 & 0x1f)) >>
                   (bVar10 & 0x1f);
          uVar15 = (iVar27 << (bVar2 & 0x1f)) + iVar18 + (iVar32 << (bVar1 & 0x1f)) >>
                   (bVar10 & 0x1f);
          *(ulong *)(auStack_838 + lVar30) = CONCAT44(iVar32,iVar31);
          uVar26 = uVar22;
          if ((int)uVar19 <= (int)uVar22) {
            uVar26 = uVar19;
          }
          pVar11 = (pel)uVar26;
          if ((int)uVar22 < 0) {
            pVar11 = '\0';
          }
          dst[lVar30] = pVar11;
          uVar26 = uVar15;
          if ((int)uVar19 <= (int)uVar15) {
            uVar26 = uVar19;
          }
          pVar11 = (pel)uVar26;
          if ((int)uVar15 < 0) {
            pVar11 = '\0';
          }
          dst[lVar30 + 1] = pVar11;
          lVar30 = lVar30 + 2;
          iVar18 = iVar18 + iVar21;
          iVar28 = iVar28 + iVar9;
        } while (lVar30 < lVar24);
      }
      dst = dst + i_dst;
      local_a88 = local_a88 + 1;
    } while (local_a88 != (uint)h);
  }
  return;
}

Assistant:

void ipred_bi_uv(pel *src, pel *dst, int i_dst, int w, int h, int bit_depth)
{
    uavs3d_assert(g_tbl_log2[w] >= 2);
    uavs3d_assert(g_tbl_log2[h] >= 2);

    int x, y;
    int ishift_x = g_tbl_log2[w];
    int ishift_y = g_tbl_log2[h];
    int ishift = COM_MIN(ishift_x, ishift_y);
    int ishift_xy = ishift_x + ishift_y + 1;
    int offset = 1 << (ishift_x + ishift_y);
    int a_u, b_u, c_u, wt_u, tmp_u;
    int a_v, b_v, c_v, wt_v, tmp_v;
    int ref_up[MAX_CU_SIZE], ref_le[MAX_CU_SIZE], up[MAX_CU_SIZE], le[MAX_CU_SIZE], wy[MAX_CU_SIZE];
    int wc, tbl_wc[6] = { -1, 21, 13, 7, 4, 2 };
    int w2 = w << 1;
    int h2 = h << 1;
    int max_pel = (1 << bit_depth) - 1;
    int val_u, val_v;

    wc = ishift_x > ishift_y ? ishift_x - ishift_y : ishift_y - ishift_x;
    uavs3d_assert(wc <= 5);

    wc = tbl_wc[wc];
    for (x = 0; x < w2; x++) {
        ref_up[x] = src[x + 2];  
    }
    for (y = 0; y < h2; y += 2) {
        ref_le[y    ] = src[-y - 2];
        ref_le[y + 1] = src[-y - 1];
    }

    a_u = src[w2];
    b_u = src[-h2];
    c_u = (w == h) ? (a_u + b_u + 1) >> 1 : (((a_u << ishift_x) + (b_u << ishift_y)) * wc + (1 << (ishift + 5))) >> (ishift + 6);
    wt_u = (c_u << 1) - a_u - b_u;

    a_v = src[w2 + 1];
    b_v = src[-h2 + 1];
    c_v = (w == h) ? (a_v + b_v + 1) >> 1 : (((a_v << ishift_x) + (b_v << ishift_y)) * wc + (1 << (ishift + 5))) >> (ishift + 6);
    wt_v = (c_v << 1) - a_v - b_v;

    for (x = 0; x < w2; x += 2) {
        up[x    ] = b_u - ref_up[x];
        up[x + 1] = b_v - ref_up[x + 1];
        ref_up[x    ] <<= ishift_y;
        ref_up[x + 1] <<= ishift_y;
    }
    tmp_u = tmp_v = 0;
    for (y = 0; y < h2; y += 2) {
        le[y    ] = a_u - ref_le[y];
        le[y + 1] = a_v - ref_le[y + 1];
        ref_le[y    ] <<= ishift_x;
        ref_le[y + 1] <<= ishift_x;
        wy[y    ] = tmp_u;
        wy[y + 1] = tmp_v;
        tmp_u += wt_u;
        tmp_v += wt_v;
    }
    for (y = 0; y < h; y++) {
        int y2 = y << 1;
        int predx_u = ref_le[y2    ];
        int predx_v = ref_le[y2 + 1];
        int wxy_u = 0;
        int wxy_v = 0;
        for (x = 0; x < w2; x += 2) {
            predx_u += le[y2];
            predx_v += le[y2 + 1];
            ref_up[x    ] += up[x];
            ref_up[x + 1] += up[x + 1];
            val_u = ((predx_u << ishift_y) + (ref_up[x    ] << ishift_x) + wxy_u + offset) >> ishift_xy;
            val_v = ((predx_v << ishift_y) + (ref_up[x + 1] << ishift_x) + wxy_v + offset) >> ishift_xy;
            dst[x    ] = COM_CLIP3(0, max_pel, val_u);
            dst[x + 1] = COM_CLIP3(0, max_pel, val_v);
            wxy_u += wy[y2];
            wxy_v += wy[y2 + 1];
        }
        dst += i_dst;
    }
}